

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Synth::processMIDI(V2Synth *this,uint8_t *cmd)

{
  byte bVar1;
  uint32_t uVar2;
  uint ctl;
  V2Sound *pVVar3;
  V2Voice *this_00;
  uint uVar4;
  byte *pbVar5;
  int local_7c;
  int local_78;
  int i_8;
  int i_7;
  int iStack_6c;
  uint8_t pgm;
  int i_6;
  int i_5;
  uint8_t val;
  int ctrl;
  V2Voice *voice;
  int local_50;
  int i_4;
  int i_3;
  uint32_t oldest_1;
  int i_2;
  uint32_t oldest;
  int i_1;
  int chanfind;
  int chanmask;
  int usevoice;
  int i;
  int npoly;
  V2Sound *sound;
  byte *pbStack_18;
  int chan;
  uint8_t *cmd_local;
  V2Synth *this_local;
  
  pbStack_18 = cmd;
  do {
    if (*pbStack_18 == 0xfd) {
      return;
    }
    if ((*pbStack_18 & 0x80) != 0) {
      this->mrstat = (uint)*pbStack_18;
      pbStack_18 = pbStack_18 + 1;
    }
    if (this->mrstat < 0x80) {
      return;
    }
    uVar4 = this->mrstat & 0xf;
    switch(this->mrstat >> 4 & 7) {
    case 1:
      if (pbStack_18[1] != 0) {
        if (uVar4 == 0xf) {
          ronanCBNoteOn((syWRonan *)&this->ronan);
        }
        pVVar3 = getpatch(this,(uint)this->chans[(int)uVar4].pgm);
        usevoice = 0;
        for (chanmask = 0; chanmask < 0x40; chanmask = chanmask + 1) {
          usevoice = (uint)(this->chanmap[chanmask] == uVar4) + usevoice;
        }
        chanfind = -1;
        if ((usevoice == 0) || (usevoice < (int)(uint)pVVar3->maxpoly)) {
          for (i_2 = 0; i_2 < 0x40; i_2 = i_2 + 1) {
            if (this->chanmap[i_2] < 0) {
              chanfind = i_2;
              break;
            }
          }
          i_1 = 0;
          oldest = 0;
        }
        else {
          i_1 = 0xf;
          oldest = uVar4;
        }
        if (chanfind < 0) {
          oldest_1 = this->curalloc;
          for (i_3 = 0; i_3 < 0x40; i_3 = i_3 + 1) {
            if ((((this->chanmap[i_3] & i_1) == oldest) && ((this->voicesw[i_3].gate & 1U) == 0)) &&
               (this->allocpos[i_3] < oldest_1)) {
              oldest_1 = this->allocpos[i_3];
              chanfind = i_3;
            }
          }
        }
        if (chanfind < 0) {
          i_4 = this->curalloc;
          for (local_50 = 0; local_50 < 0x40; local_50 = local_50 + 1) {
            if (((this->chanmap[local_50] & i_1) == oldest) &&
               (this->allocpos[local_50] < (uint)i_4)) {
              i_4 = this->allocpos[local_50];
              chanfind = local_50;
            }
          }
        }
        if (chanfind < 0) {
          __assert_fail("usevoice >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jgilje[P]v2m-player/src/synth_core.cpp"
                        ,0xb3d,"void V2Synth::processMIDI(const uint8_t *)");
        }
        this->chanmap[chanfind] = uVar4;
        this->voicemap[(int)uVar4] = chanfind;
        uVar2 = this->curalloc;
        this->curalloc = uVar2 + 1;
        this->allocpos[chanfind] = uVar2;
        storeV2Values(this,chanfind);
        V2Voice::noteOn(this->voicesw + chanfind,(uint)*pbStack_18,(uint)pbStack_18[1]);
        pbStack_18 = pbStack_18 + 2;
        break;
      }
    case 0:
      if (uVar4 == 0xf) {
        ronanCBNoteOff((syWRonan *)&this->ronan);
      }
      for (voice._4_4_ = 0; voice._4_4_ < 0x40; voice._4_4_ = voice._4_4_ + 1) {
        if (((this->chanmap[voice._4_4_] == uVar4) &&
            (this_00 = this->voicesw + voice._4_4_, this_00->note == (uint)*pbStack_18)) &&
           ((this_00->gate & 1U) != 0)) {
          V2Voice::noteOff(this_00);
        }
      }
      pbStack_18 = pbStack_18 + 2;
      break;
    case 2:
      pbStack_18 = pbStack_18 + 1;
      break;
    case 3:
      ctl = (uint)*pbStack_18;
      bVar1 = pbStack_18[1];
      if ((ctl == 0) || (7 < ctl)) {
        if (ctl == 0x78) {
          for (iStack_6c = 0; iStack_6c < 0x40; iStack_6c = iStack_6c + 1) {
            if (this->chanmap[iStack_6c] == uVar4) {
              V2Voice::init(this->voicesw + iStack_6c,(EVP_PKEY_CTX *)&this->instance);
              this->chanmap[iStack_6c] = -1;
            }
          }
        }
        else if (ctl == 0x7b) {
          if (uVar4 == 0xf) {
            ronanCBNoteOff((syWRonan *)&this->ronan);
          }
          for (i_7 = 0; i_7 < 0x40; i_7 = i_7 + 1) {
            if (this->chanmap[i_7] == uVar4) {
              V2Voice::noteOff(this->voicesw + i_7);
            }
          }
        }
      }
      else {
        this->chans[(int)uVar4].ctl[(int)(ctl - 1)] = bVar1;
        if (uVar4 == 0xf) {
          ronanCBSetCtl((syWRonan *)&this->ronan,ctl,(uint)bVar1);
        }
      }
      pbStack_18 = pbStack_18 + 2;
      break;
    case 4:
      pbVar5 = pbStack_18 + 1;
      if (this->chans[(int)uVar4].pgm != (*pbStack_18 & 0x7f)) {
        this->chans[(int)uVar4].pgm = *pbStack_18 & 0x7f;
        for (local_78 = 0; local_78 < 0x40; local_78 = local_78 + 1) {
          if (this->chanmap[local_78] == uVar4) {
            this->chanmap[local_78] = -1;
          }
        }
      }
      for (local_7c = 0; pbStack_18 = pbVar5, local_7c < 6; local_7c = local_7c + 1) {
        this->chans[(int)uVar4].ctl[local_7c] = '\0';
      }
      break;
    case 5:
      pbStack_18 = pbStack_18 + 2;
      break;
    case 6:
      pbStack_18 = pbStack_18 + 2;
      break;
    case 7:
      if (uVar4 == 0xf) {
        init(this,(EVP_PKEY_CTX *)this->patchmap->raw_data);
      }
    }
  } while( true );
}

Assistant:

void processMIDI(const uint8_t *cmd)
    {
        while (*cmd != 0xfd) // until end of stream
        {
            if (*cmd & 0x80) // start of message
                mrstat = *cmd++;

            if (mrstat < 0x80) // we don't have a current message? uhm...
                break;

            int chan = mrstat & 0xf;
            switch ((mrstat >> 4) & 7)
            {
            case 1: // Note on
                if (cmd[1] != 0) // velocity==0 is actually a note off
                {
                    COVER("MIDI note on");
                    if (chan == CHANS - 1)
                        ronanCBNoteOn(&ronan);

                    // calculate current polyphony for this channel
                    const V2Sound *sound = getpatch(chans[chan].pgm);
                    int npoly = 0;
                    for (int i = 0; i < POLY; i++)
                        npoly += (chanmap[i] == chan);

                    // voice allocation. this is equivalent to the original V2 code,
                    // but hopefully simpler to follow.
                    int usevoice = -1;
                    int chanmask, chanfind;

                    if (!npoly || npoly < sound->maxpoly) // even if maxpoly is 0, allow at least 1.
                    {
                        // if we haven't reached polyphony limit yet, try to find a free voice
                        // first.
                        for (int i=0; i < POLY; i++)
                        {
                            if (chanmap[i] < 0)
                            {
                                usevoice = i;
                                break;
                            }
                        }

                        // okay, need to find a free voice. we'll take any channel.
                        COVER("SYN find voice any");
                        chanmask = 0;
                        chanfind = 0;
                    } else
                    {
                        // if we're at polyphony limit, we know there's at least one voice
                        // used by this channel, so we can limit ourselves to killing
                        // voices from our own chan.
                        COVER("SYN find voice channel");
                        chanmask = 0xf;
                        chanfind = chan;
                    }

                    // don't have a voice yet? kill oldest eligible one with gate off.
                    if (usevoice < 0)
                    {
                        COVER("SYN replace voice gate off");
                        uint32_t oldest = curalloc;
                        for (int i = 0; i < POLY; i++)
                        {
                            if ((chanmap[i] & chanmask) == chanfind && !voicesw[i].gate && allocpos[i] < oldest)
                            {
                                oldest = allocpos[i];
                                usevoice = i;
                            }
                        }
                    }

                    // still no voice? okay, just take the oldest one we can find, period.
                    if (usevoice < 0)
                    {
                        COVER("SYN replace voice oldest");
                        uint32_t oldest = curalloc;
                        for (int i = 0; i < POLY; i++)
                        {
                            if ((chanmap[i] & chanmask) == chanfind && allocpos[i] < oldest)
                            {
                                oldest = allocpos[i];
                                usevoice = i;
                            }
                        }
                    }

                    // we have our voice - assign it!
                    assert(usevoice >= 0);
                    chanmap[usevoice] = chan;
                    voicemap[chan] = usevoice;
                    allocpos[usevoice] = curalloc++;

                    // and note on!
                    storeV2Values(usevoice);
                    voicesw[usevoice].noteOn(cmd[0], cmd[1]);
                    cmd += 2;
                    break;
                }
                // fall-through (for when we had a note off)

            case 0: // Note off
                COVER("MIDI note off");
                if (chan == CHANS - 1)
                    ronanCBNoteOff(&ronan);

                for (int i = 0; i < POLY; i++)
                {
                    if (chanmap[i] != chan)
                        continue;
                    V2Voice *voice = &voicesw[i];
                    if (voice->note == cmd[0] && voice->gate)
                        voice->noteOff();
                }
                cmd += 2;
                break;

            case 2: // Aftertouch
                COVER("MIDI aftertouch");
                cmd++; // ignored
                break;

            case 3: // Control change
            {
                COVER("MIDI controller change");
                int ctrl = cmd[0];
                uint8_t val = cmd[1];
                if (ctrl >= 1 && ctrl <= 7)
                {
                    chans[chan].ctl[ctrl - 1] = val;
                    if (chan == CHANS-1)
                        ronanCBSetCtl(&ronan, ctrl, val);
                }
                else if (ctrl == 120) // CC #120: all sound off
                {
                    COVER("MIDI CC all sound off");
                    for (int i=0; i < POLY; i++)
                    {
                        if (chanmap[i] != chan)
                            continue;

                        voicesw[i].init(&instance);
                        chanmap[i] = -1;
                    }
                }
                else if (ctrl == 123) // CC #123: all notes off
                {
                    COVER("MIDI CC all notes off");
                    if (chan == CHANS-1)
                        ronanCBNoteOff(&ronan);

                    for (int i=0; i < POLY; i++)
                    {
                        if (chanmap[i] == chan)
                            voicesw[i].noteOff();
                    }
                }
                cmd += 2;
                break;
            }

            case 4: // Program change
            {
                COVER("MIDI program change");
                uint8_t pgm = *cmd++ & 0x7f;
                // did the program actually change?
                if (chans[chan].pgm != pgm)
                {
                    COVER("MIDI program change real");
                    chans[chan].pgm = pgm;

                    // need to turn all voices on this channel off.
                    for (int i=0; i < POLY; i++)
                    {
                        if (chanmap[i] == chan)
                            chanmap[i] = -1;
                    }
                }

                // either way, reset controllers
                for (int i=0; i < 6; i++)
                    chans[chan].ctl[i] = 0;
                break;
            }

            case 5: // Pitch bend
                COVER("MIDI pitch bend");
                cmd += 2; // ignored
                break;

            case 6: // Poly Aftertouch
                COVER("MIDI poly aftertouch");
                cmd += 2; // ignored
                break;

            case 7: // System
                COVER("MIDI system exclusive");
                if (chan == 0xf) // Reset
                    init(patchmap, samplerate);
                break; // rest ignored
            }
        }
    }